

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O3

void __thiscall duckdb::BuiltinFunctions::Initialize(BuiltinFunctions *this)

{
  string local_3f8;
  string local_3d8;
  string local_3b8;
  ScalarFunction local_398;
  ScalarFunction local_270;
  ScalarFunction local_148;
  
  RegisterTableScanFunctions(this);
  RegisterSQLiteFunctions(this);
  RegisterReadFunctions(this);
  RegisterTableFunctions(this);
  RegisterArrowFunctions(this);
  RegisterPragmaFunctions(this);
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"nocase","");
  LowerFun::GetFunction();
  AddCollation(this,&local_3b8,&local_148,true,false);
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_148.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_148.function.super__Function_base._M_manager)
              ((_Any_data *)&local_148.function,(_Any_data *)&local_148.function,__destroy_functor);
  }
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  LogicalType::~LogicalType(&local_148.super_BaseScalarFunction.return_type);
  SimpleFunction::~SimpleFunction((SimpleFunction *)&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p);
  }
  local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"noaccent","");
  StripAccentsFun::GetFunction();
  AddCollation(this,&local_3d8,&local_270,true,false);
  local_270.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_270.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_270.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_270.function.super__Function_base._M_manager)
              ((_Any_data *)&local_270.function,(_Any_data *)&local_270.function,__destroy_functor);
  }
  local_270.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  LogicalType::~LogicalType(&local_270.super_BaseScalarFunction.return_type);
  SimpleFunction::~SimpleFunction((SimpleFunction *)&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p);
  }
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"nfc","");
  NFCNormalizeFun::GetFunction();
  AddCollation(this,&local_3f8,&local_398,false,false);
  local_398.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_01963628;
  if (local_398.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_398.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_398.function.super__Function_base._M_manager)
              ((_Any_data *)&local_398.function,(_Any_data *)&local_398.function,__destroy_functor);
  }
  local_398.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_01963d30;
  LogicalType::~LogicalType(&local_398.super_BaseScalarFunction.return_type);
  SimpleFunction::~SimpleFunction((SimpleFunction *)&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  RegisterExtensionOverloads(this);
  return;
}

Assistant:

void BuiltinFunctions::Initialize() {
	RegisterTableScanFunctions();
	RegisterSQLiteFunctions();
	RegisterReadFunctions();
	RegisterTableFunctions();
	RegisterArrowFunctions();

	RegisterPragmaFunctions();

	// initialize collations
	AddCollation("nocase", LowerFun::GetFunction(), true);
	AddCollation("noaccent", StripAccentsFun::GetFunction(), true);
	AddCollation("nfc", NFCNormalizeFun::GetFunction());

	RegisterExtensionOverloads();
}